

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateCompoundVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,int expandLevel)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  TestNode *node;
  deInt32 *pdVar5;
  SharedPtr local_40;
  
  if (0 < expandLevel) {
    pNVar3 = (Node *)operator_new(0x20);
    pNVar1 = parentStructure->m_ptr;
    pSVar2 = parentStructure->m_state;
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = pNVar1;
    (pNVar3->m_enclosingNode).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar5 = *pdVar5 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    local_40.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_40.m_state = pSVar4;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,"struct","Structs");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
    generateVariableCases
              (context,&local_40,(TestCaseGroup *)node,queryTarget,expandLevel,expandLevel != 1);
    generateOpaqueTypeCases
              (context,&local_40,(TestCaseGroup *)node,queryTarget,expandLevel,expandLevel != 1);
    generateVariableArrayCases(context,&local_40,(TestCaseGroup *)node,queryTarget,expandLevel + -1)
    ;
    generateCompoundVariableCases
              (context,&local_40,(TestCaseGroup *)node,queryTarget,expandLevel + -1);
    pSVar2 = local_40.m_state;
    pdVar5 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_40.m_ptr = (Node *)0x0;
      (*(local_40.m_state)->_vptr_SharedPtrStateBase[2])(local_40.m_state);
    }
    LOCK();
    pdVar5 = &pSVar2->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if ((*pdVar5 == 0) && (local_40.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_40.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateCompoundVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, int expandLevel)
{
	if (expandLevel > 0)
	{
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		tcu::TestCaseGroup* const					blockGroup		= new tcu::TestCaseGroup(context.getTestContext(), "struct", "Structs");

		targetGroup->addChild(blockGroup);

		// Struct containing basic variable
		generateVariableCases(context, structMember, blockGroup, queryTarget, expandLevel, expandLevel != 1);

		// Struct containing opaque types
		generateOpaqueTypeCases(context, structMember, blockGroup, queryTarget, expandLevel, expandLevel != 1);

		// Struct containing arrays
		generateVariableArrayCases(context, structMember, blockGroup, queryTarget, expandLevel-1);

		// Struct containing struct
		generateCompoundVariableCases(context, structMember, blockGroup, queryTarget, expandLevel-1);
	}
}